

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mate_obj.c
# Opt level: O1

ObjModule * newObjModule(VM *vm,char *modName)

{
  ObjModule *objHeader;
  size_t sVar1;
  ObjString *pOVar2;
  
  objHeader = (ObjModule *)memManager(vm,(void *)0x0,0,0x40);
  if (objHeader == (ObjModule *)0x0) {
    errorReport((void *)0x0,ERROR_MEM,"allocate ObjModule failed!");
  }
  initObjHeader(vm,(ObjHeader *)objHeader,OT_MODULE,(Class *)0x0);
  StringBufferInit(&objHeader->moduleVarName);
  ValueBufferInit(&objHeader->moduleVarValue);
  objHeader->name = (ObjString *)0x0;
  if (modName != (char *)0x0) {
    sVar1 = strlen(modName);
    pOVar2 = newObjString(vm,modName,(uint32_t)sVar1);
    objHeader->name = pOVar2;
  }
  return objHeader;
}

Assistant:

ObjModule *newObjModule(VM *vm, const char *modName) {
    ObjModule *objModule = ALLOCATE(vm, ObjModule);
    if (objModule == NULL) {
        MEM_ERROR("allocate ObjModule failed!");
    }

    initObjHeader(vm, &objModule->objHeader, OT_MODULE, NULL);

    StringBufferInit(&objModule->moduleVarName);
    ValueBufferInit(&objModule->moduleVarValue);

    objModule->name = NULL;
    if (modName != NULL) {
        objModule->name = newObjString(vm, modName, strlen(modName));
    }

    return objModule;
}